

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollable.c
# Opt level: O0

int nni_pollable_getfd(nni_pollable *p,int *fdp)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  uint64_t fds;
  int local_28;
  int rv;
  int wfd;
  int rfd;
  int *fdp_local;
  nni_pollable *p_local;
  
  _wfd = fdp;
  fdp_local = (int *)p;
  if (p == (nni_pollable *)0x0) {
    p_local._4_4_ = 3;
  }
  else {
    while (uVar3 = nni_atomic_get64((nni_atomic_u64 *)fdp_local), uVar3 == 0xffffffffffffffff) {
      iVar2 = nni_plat_pipe_open(&local_28,&rv);
      if (iVar2 != 0) {
        return iVar2;
      }
      _Var1 = nni_atomic_cas64((nni_atomic_u64 *)fdp_local,0xffffffffffffffff,
                               (long)local_28 + ((long)rv << 0x20));
      if (_Var1) {
        _Var1 = nni_atomic_get_bool((nni_atomic_bool *)(fdp_local + 2));
        if (_Var1) {
          nni_plat_pipe_raise(local_28);
        }
        *_wfd = rv;
        return 0;
      }
      nni_plat_pipe_close(local_28,rv);
    }
    *_wfd = (int)(uVar3 >> 0x20);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int
nni_pollable_getfd(nni_pollable *p, int *fdp)
{
	if (p == NULL) {
		return (NNG_EINVAL);
	}

	for (;;) {
		int      rfd;
		int      wfd;
		int      rv;
		uint64_t fds;

		if ((fds = nni_atomic_get64(&p->p_fds)) != (uint64_t) -1) {
			*fdp = RFD(fds);
			return (0);
		}
		if ((rv = nni_plat_pipe_open(&wfd, &rfd)) != 0) {
			return (rv);
		}
		fds = FD_JOIN(wfd, rfd);

		if (nni_atomic_cas64(&p->p_fds, (uint64_t) -1, fds)) {
			if (nni_atomic_get_bool(&p->p_raised)) {
				nni_plat_pipe_raise(wfd);
			}
			*fdp = rfd;
			return (0);
		}

		// Someone beat us.  Close ours, and try again.
		nni_plat_pipe_close(wfd, rfd);
	}
}